

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> * __thiscall
helics::CommonCore::getLocalEndpoint(CommonCore *this,string_view name)

{
  type puVar1;
  anon_class_8_1_898f2789 *in_stack_00000008;
  
  puVar1 = gmlc::libguarded::ordered_guarded<helics::HandleManager,std::shared_mutex>::
           read<helics::CommonCore::getLocalEndpoint(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                     ((ordered_guarded<helics::HandleManager,_std::shared_mutex> *)this,
                      in_stack_00000008);
  return puVar1;
}

Assistant:

const BasicHandleInfo* CommonCore::getLocalEndpoint(std::string_view name) const
{
    return handles.read(
        [&name](auto& hand) { return hand.getInterfaceHandle(name, InterfaceType::ENDPOINT); });
}